

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_2e4871d::PeerManagerImpl::PackageToValidate::PackageToValidate
          (PackageToValidate *this,CTransactionRef *parent,CTransactionRef *child,
          NodeId parent_sender,NodeId child_sender)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  long lVar2;
  long in_FS_OFFSET;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l;
  initializer_list<long> __l_00;
  undefined8 uStack_50;
  shared_ptr<const_CTransaction> local_48;
  undefined8 local_38;
  long local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (child != (CTransactionRef *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(child->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount;
      *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
      UNLOCK();
    }
    else {
      p_Var1 = &(child->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount;
      *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
    }
  }
  local_38 = *(undefined8 *)parent_sender;
  local_30 = *(long *)(parent_sender + 8);
  if (local_30 != 0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_30 + 8) = *(int *)(local_30 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_30 + 8) = *(int *)(local_30 + 8) + 1;
    }
  }
  __l._M_len = 2;
  __l._M_array = &local_48;
  local_48.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)parent;
  local_48.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)child;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(&this->m_txns,__l,(allocator_type *)((long)&uStack_50 + 7));
  lVar2 = 0x20;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_50 + lVar2) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_50 + lVar2));
    }
    lVar2 = lVar2 + -0x10;
  } while (lVar2 != 0);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_48;
  local_48.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)child_sender;
  std::vector<long,_std::allocator<long>_>::vector
            (&this->m_senders,__l_00,(allocator_type *)((long)&uStack_50 + 7));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit PackageToValidate(const CTransactionRef& parent,
                                   const CTransactionRef& child,
                                   NodeId parent_sender,
                                   NodeId child_sender) :
            m_txns{parent, child},
            m_senders {parent_sender, child_sender}
        {}